

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::setCapacity
          (Vector<capnp::compiler::CompilerMain::OutputDirective> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> newBuilder;
  size_t newSize_local;
  Vector<capnp::compiler::CompilerMain::OutputDirective> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>
            ((ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *)local_38,
             (size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>>(&this->builder);
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::
  addAll<kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>>
            ((ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>>
                     ((ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *)local_38);
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::operator=(&this->builder,pAVar2);
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::~ArrayBuilder
            ((ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }